

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int set_array_length(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  JSValue v_00;
  JSValue val_00;
  JSValue new_val;
  int iVar1;
  BOOL BVar2;
  JSContext *in_RDX;
  long in_RSI;
  JSContext *in_RDI;
  uint in_R8D;
  JSValue JVar3;
  JSAtom atom;
  JSShapeProperty *pr;
  JSShape *sh;
  uint32_t d;
  uint32_t old_len;
  int ret;
  int i;
  uint32_t cur_len;
  uint32_t idx;
  uint32_t len;
  JSValue v_1;
  JSValue v;
  undefined4 in_stack_fffffffffffffe98;
  JSAtom in_stack_fffffffffffffe9c;
  JSContext *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar4;
  JSAtom in_stack_fffffffffffffeac;
  undefined4 uVar5;
  JSContext *in_stack_fffffffffffffeb0;
  JSValueUnion *pJVar6;
  JSContext *in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  JSAtom in_stack_fffffffffffffecc;
  JSShapeProperty *local_130;
  undefined8 in_stack_fffffffffffffed8;
  JSShape *sh_00;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  JSContext *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint uVar7;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  int local_c4;
  JSValueUnion local_c0;
  int64_t local_b8;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  double local_58;
  JSValueUnion local_30;
  double local_28;
  undefined4 uStack_c;
  
  JVar3.tag._0_4_ = in_stack_fffffffffffffef8;
  JVar3.u = (JSValueUnion)in_stack_fffffffffffffef0;
  JVar3.tag._4_4_ = in_stack_fffffffffffffefc;
  iVar1 = JS_ToArrayLengthFree
                    (in_stack_fffffffffffffee8,
                     (uint32_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),JVar3
                     ,(BOOL)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  if (iVar1 == 0) {
    if ((*(uint *)(*(long *)(in_RSI + 0x18) + 0x40) >> 0x1a & 2) == 0) {
      local_c4 = JS_ThrowTypeErrorReadOnly
                           ((JSContext *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                            (JSAtom)in_stack_fffffffffffffea0);
    }
    else {
      if ((*(byte *)(in_RSI + 5) >> 3 & 1) == 0) {
        val_00.u._4_4_ = in_stack_fffffffffffffeac;
        val_00.u.int32 = in_stack_fffffffffffffea8;
        val_00.tag = (int64_t)in_stack_fffffffffffffeb0;
        JS_ToUint32(in_stack_fffffffffffffea0,
                    (uint32_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),val_00
                   );
        if (local_f0 < local_f8) {
          sh_00 = *(JSShape **)(in_RSI + 0x18);
          if ((uint)sh_00->prop_count < local_f8 - local_f0) {
            local_f8 = local_f0;
            local_fc = 0;
            local_130 = get_shape_prop(sh_00);
            for (; (int)local_fc < sh_00->prop_count; local_fc = local_fc + 1) {
              if ((((local_130->atom != 0) &&
                   (BVar2 = JS_AtomIsArrayIndex(in_stack_fffffffffffffeb8,
                                                (uint32_t *)in_stack_fffffffffffffeb0,
                                                in_stack_fffffffffffffeac), BVar2 != 0)) &&
                  (local_f8 <= local_f4)) && ((*(uint *)local_130 >> 0x1a & 1) == 0)) {
                local_f8 = local_f4 + 1;
              }
              local_130 = local_130 + 1;
            }
            local_fc = 0;
            local_130 = get_shape_prop(sh_00);
            for (; (int)local_fc < sh_00->prop_count; local_fc = local_fc + 1) {
              if (((local_130->atom != 0) &&
                  (BVar2 = JS_AtomIsArrayIndex(in_stack_fffffffffffffeb8,
                                               (uint32_t *)in_stack_fffffffffffffeb0,
                                               in_stack_fffffffffffffeac), BVar2 != 0)) &&
                 (local_f8 <= local_f4)) {
                delete_property(in_RDX,(JSObject *)in_RDI,(JSAtom)((ulong)in_RSI >> 0x20));
                sh_00 = *(JSShape **)(in_RSI + 0x18);
                local_130 = get_shape_prop(sh_00);
                local_130 = local_130 + (int)local_fc;
              }
              local_130 = local_130 + 1;
            }
          }
          else {
            for (; local_f0 < local_f8; local_f8 = local_f8 - 1) {
              in_stack_fffffffffffffecc =
                   JS_NewAtomUInt32((JSContext *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    in_stack_fffffffffffffec4);
              iVar1 = delete_property(in_RDX,(JSObject *)in_RDI,(JSAtom)((ulong)in_RSI >> 0x20));
              JS_FreeAtom(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
              if (iVar1 == 0) break;
            }
          }
        }
        else {
          local_f8 = local_f0;
        }
        uVar4 = (undefined4)*(undefined8 *)(in_RSI + 0x20);
        uVar5 = (undefined4)((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20);
        if (local_f8 < 0x80000000) {
          local_c0._4_4_ = uStack_6c;
          local_c0.int32 = local_f8;
          local_b8 = 0;
        }
        else {
          JVar3 = __JS_NewFloat64(in_RDI,(double)local_f8);
          local_c0 = JVar3.u;
          local_b8 = JVar3.tag;
        }
        new_val.tag._0_4_ = (int)local_b8;
        new_val.u.float64 = local_c0.float64;
        new_val.tag._4_4_ = (int)((ulong)local_b8 >> 0x20);
        set_value(in_stack_fffffffffffffeb0,(JSValue *)CONCAT44(uVar5,uVar4),new_val);
        if (local_f0 < local_f8) {
          iVar1 = JS_ThrowTypeErrorOrFalse(in_RDI,(int)(ulong)in_R8D,"not configurable");
          return iVar1;
        }
      }
      else {
        uVar7 = *(uint *)(in_RSI + 0x40);
        if (local_f0 < uVar7) {
          for (local_fc = local_f0; local_fc < uVar7; local_fc = local_fc + 1) {
            v_00.u._4_4_ = in_stack_fffffffffffffeac;
            v_00.u.int32 = in_stack_fffffffffffffea8;
            v_00.tag = (int64_t)in_stack_fffffffffffffeb0;
            JS_FreeValue(in_stack_fffffffffffffea0,v_00);
          }
          *(uint *)(in_RSI + 0x40) = local_f0;
        }
        pJVar6 = *(JSValueUnion **)(in_RSI + 0x20);
        if (local_f0 < 0x80000000) {
          local_30._4_4_ = uStack_c;
          local_30.int32 = local_f0;
          local_28 = 0.0;
        }
        else {
          JVar3 = __JS_NewFloat64(in_RDI,(double)local_f0);
          local_60 = JVar3.u;
          local_30 = local_60;
          local_58 = (double)JVar3.tag;
          local_28 = local_58;
        }
        *pJVar6 = local_30;
        pJVar6[1].float64 = local_28;
      }
      local_c4 = 1;
    }
  }
  else {
    local_c4 = -1;
  }
  return local_c4;
}

Assistant:

static int set_array_length(JSContext *ctx, JSObject *p, JSValue val,
                            int flags)
{
    uint32_t len, idx, cur_len;
    int i, ret;

    /* Note: this call can reallocate the properties of 'p' */
    ret = JS_ToArrayLengthFree(ctx, &len, val, FALSE);
    if (ret)
        return -1;
    /* JS_ToArrayLengthFree() must be done before the read-only test */
    if (unlikely(!(p->shape->prop[0].flags & JS_PROP_WRITABLE)))
        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);

    if (likely(p->fast_array)) {
        uint32_t old_len = p->u.array.count;
        if (len < old_len) {
            for(i = len; i < old_len; i++) {
                JS_FreeValue(ctx, p->u.array.u.values[i]);
            }
            p->u.array.count = len;
        }
        p->prop[0].u.value = JS_NewUint32(ctx, len);
    } else {
        /* Note: length is always a uint32 because the object is an
           array */
        JS_ToUint32(ctx, &cur_len, p->prop[0].u.value);
        if (len < cur_len) {
            uint32_t d;
            JSShape *sh;
            JSShapeProperty *pr;

            d = cur_len - len;
            sh = p->shape;
            if (d <= sh->prop_count) {
                JSAtom atom;

                /* faster to iterate */
                while (cur_len > len) {
                    atom = JS_NewAtomUInt32(ctx, cur_len - 1);
                    ret = delete_property(ctx, p, atom);
                    JS_FreeAtom(ctx, atom);
                    if (unlikely(!ret)) {
                        /* unlikely case: property is not
                           configurable */
                        break;
                    }
                    cur_len--;
                }
            } else {
                /* faster to iterate thru all the properties. Need two
                   passes in case one of the property is not
                   configurable */
                cur_len = len;
                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len &&
                            !(pr->flags & JS_PROP_CONFIGURABLE)) {
                            cur_len = idx + 1;
                        }
                    }
                }

                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len) {
                            /* remove the property */
                            delete_property(ctx, p, pr->atom);
                            /* WARNING: the shape may have been modified */
                            sh = p->shape;
                            pr = get_shape_prop(sh) + i;
                        }
                    }
                }
            }
        } else {
            cur_len = len;
        }
        set_value(ctx, &p->prop[0].u.value, JS_NewUint32(ctx, cur_len));
        if (unlikely(cur_len > len)) {
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "not configurable");
        }
    }
    return TRUE;
}